

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

int L3_read_side_info(bs_t *bs,L3_gr_info_t *gr,uint8_t *hdr)

{
  undefined1 uVar1;
  int iVar2;
  uint32_t uVar3;
  long in_RDX;
  int n;
  undefined8 *in_RSI;
  bs_t *in_RDI;
  int gr_count;
  int sr_idx;
  int part_23_sum;
  int main_data_begin;
  uint scfsi;
  uint tables;
  undefined1 local_3c;
  int local_38;
  int local_30;
  uint32_t local_2c;
  uint32_t local_28;
  uint local_24;
  undefined8 *local_18;
  uint32_t local_4;
  
  local_28 = 0;
  local_30 = 0;
  iVar2 = ((int)(uint)*(byte *)(in_RDX + 2) >> 2 & 3U) +
          (((int)(uint)*(byte *)(in_RDX + 1) >> 3 & 1U) +
          ((int)(uint)*(byte *)(in_RDX + 1) >> 4 & 1U)) * 3;
  iVar2 = iVar2 - (uint)(iVar2 != 0);
  local_38 = 2;
  if ((*(byte *)(in_RDX + 3) & 0xc0) == 0xc0) {
    local_38 = 1;
  }
  local_18 = in_RSI;
  if ((*(byte *)(in_RDX + 1) & 8) == 0) {
    local_2c = get_bits(in_RDI,local_38 + 8);
    local_2c = local_2c >> (sbyte)local_38;
  }
  else {
    local_38 = local_38 * 2;
    local_2c = get_bits(in_RDI,9);
    local_28 = get_bits(in_RDI,local_38 + 7);
  }
  do {
    if ((*(byte *)(in_RDX + 3) & 0xc0) == 0xc0) {
      local_28 = local_28 << 4;
    }
    uVar3 = get_bits(in_RDI,0xc);
    *(short *)(local_18 + 1) = (short)uVar3;
    local_30 = (uint)*(ushort *)(local_18 + 1) + local_30;
    uVar3 = get_bits(in_RDI,9);
    *(short *)((long)local_18 + 10) = (short)uVar3;
    if (0x120 < *(ushort *)((long)local_18 + 10)) {
      return -1;
    }
    uVar3 = get_bits(in_RDI,8);
    *(char *)((long)local_18 + 0xe) = (char)uVar3;
    n = 9;
    if ((*(byte *)(in_RDX + 1) & 8) != 0) {
      n = 4;
    }
    uVar3 = get_bits(in_RDI,n);
    *(short *)((long)local_18 + 0xc) = (short)uVar3;
    *local_18 = L3_read_side_info::g_scf_long + iVar2;
    *(undefined1 *)((long)local_18 + 0x11) = 0x16;
    *(undefined1 *)((long)local_18 + 0x12) = 0;
    uVar3 = get_bits(in_RDI,1);
    if (uVar3 == 0) {
      *(undefined1 *)((long)local_18 + 0xf) = 0;
      *(undefined1 *)(local_18 + 2) = 0;
      local_24 = get_bits(in_RDI,0xf);
      uVar3 = get_bits(in_RDI,4);
      *(char *)((long)local_18 + 0x16) = (char)uVar3;
      uVar3 = get_bits(in_RDI,3);
      *(char *)((long)local_18 + 0x17) = (char)uVar3;
      *(undefined1 *)(local_18 + 3) = 0xff;
    }
    else {
      uVar3 = get_bits(in_RDI,2);
      *(char *)((long)local_18 + 0xf) = (char)uVar3;
      if (*(char *)((long)local_18 + 0xf) == '\0') {
        return -1;
      }
      uVar3 = get_bits(in_RDI,1);
      *(char *)(local_18 + 2) = (char)uVar3;
      *(undefined1 *)((long)local_18 + 0x16) = 7;
      *(undefined1 *)((long)local_18 + 0x17) = 0xff;
      if (*(char *)((long)local_18 + 0xf) == '\x02') {
        local_28 = local_28 & 0xf0f;
        if (*(char *)(local_18 + 2) == '\0') {
          *(undefined1 *)((long)local_18 + 0x16) = 8;
          *local_18 = L3_read_side_info::g_scf_short + iVar2;
          *(undefined1 *)((long)local_18 + 0x11) = 0;
          *(undefined1 *)((long)local_18 + 0x12) = 0x27;
        }
        else {
          *local_18 = L3_read_side_info::g_scf_mixed + iVar2;
          uVar1 = 6;
          if ((*(byte *)(in_RDX + 1) & 8) != 0) {
            uVar1 = 8;
          }
          *(undefined1 *)((long)local_18 + 0x11) = uVar1;
          *(undefined1 *)((long)local_18 + 0x12) = 0x1e;
        }
      }
      uVar3 = get_bits(in_RDI,10);
      local_24 = uVar3 << 5;
      uVar3 = get_bits(in_RDI,3);
      *(char *)((long)local_18 + 0x19) = (char)uVar3;
      uVar3 = get_bits(in_RDI,3);
      *(char *)((long)local_18 + 0x1a) = (char)uVar3;
      uVar3 = get_bits(in_RDI,3);
      *(char *)((long)local_18 + 0x1b) = (char)uVar3;
    }
    *(char *)((long)local_18 + 0x13) = (char)(local_24 >> 10);
    *(byte *)((long)local_18 + 0x14) = (byte)(local_24 >> 5) & 0x1f;
    *(byte *)((long)local_18 + 0x15) = (byte)local_24 & 0x1f;
    if ((*(byte *)(in_RDX + 1) & 8) == 0) {
      local_3c = 499 < *(ushort *)((long)local_18 + 0xc);
    }
    else {
      uVar3 = get_bits(in_RDI,1);
      local_3c = (undefined1)uVar3;
    }
    *(undefined1 *)((long)local_18 + 0x1c) = local_3c;
    uVar3 = get_bits(in_RDI,1);
    *(char *)((long)local_18 + 0x1d) = (char)uVar3;
    uVar3 = get_bits(in_RDI,1);
    *(char *)((long)local_18 + 0x1e) = (char)uVar3;
    *(byte *)((long)local_18 + 0x1f) = (byte)(local_28 >> 0xc) & 0xf;
    local_28 = local_28 << 4;
    local_18 = local_18 + 4;
    local_38 = local_38 + -1;
  } while (local_38 != 0);
  if ((int)(in_RDI->limit + local_2c * 8) < local_30 + in_RDI->pos) {
    local_4 = 0xffffffff;
  }
  else {
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static int L3_read_side_info(bs_t *bs, L3_gr_info_t *gr, const uint8_t *hdr)
{
    static const uint8_t g_scf_long[8][23] = {
        { 6,6,6,6,6,6,8,10,12,14,16,20,24,28,32,38,46,52,60,68,58,54,0 },
        { 12,12,12,12,12,12,16,20,24,28,32,40,48,56,64,76,90,2,2,2,2,2,0 },
        { 6,6,6,6,6,6,8,10,12,14,16,20,24,28,32,38,46,52,60,68,58,54,0 },
        { 6,6,6,6,6,6,8,10,12,14,16,18,22,26,32,38,46,54,62,70,76,36,0 },
        { 6,6,6,6,6,6,8,10,12,14,16,20,24,28,32,38,46,52,60,68,58,54,0 },
        { 4,4,4,4,4,4,6,6,8,8,10,12,16,20,24,28,34,42,50,54,76,158,0 },
        { 4,4,4,4,4,4,6,6,6,8,10,12,16,18,22,28,34,40,46,54,54,192,0 },
        { 4,4,4,4,4,4,6,6,8,10,12,16,20,24,30,38,46,56,68,84,102,26,0 }
    };
    static const uint8_t g_scf_short[8][40] = {
        { 4,4,4,4,4,4,4,4,4,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,24,24,24,30,30,30,40,40,40,18,18,18,0 },
        { 8,8,8,8,8,8,8,8,8,12,12,12,16,16,16,20,20,20,24,24,24,28,28,28,36,36,36,2,2,2,2,2,2,2,2,2,26,26,26,0 },
        { 4,4,4,4,4,4,4,4,4,6,6,6,6,6,6,8,8,8,10,10,10,14,14,14,18,18,18,26,26,26,32,32,32,42,42,42,18,18,18,0 },
        { 4,4,4,4,4,4,4,4,4,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,24,24,24,32,32,32,44,44,44,12,12,12,0 },
        { 4,4,4,4,4,4,4,4,4,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,24,24,24,30,30,30,40,40,40,18,18,18,0 },
        { 4,4,4,4,4,4,4,4,4,4,4,4,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,22,22,22,30,30,30,56,56,56,0 },
        { 4,4,4,4,4,4,4,4,4,4,4,4,6,6,6,6,6,6,10,10,10,12,12,12,14,14,14,16,16,16,20,20,20,26,26,26,66,66,66,0 },
        { 4,4,4,4,4,4,4,4,4,4,4,4,6,6,6,8,8,8,12,12,12,16,16,16,20,20,20,26,26,26,34,34,34,42,42,42,12,12,12,0 }
    };
    static const uint8_t g_scf_mixed[8][40] = {
        { 6,6,6,6,6,6,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,24,24,24,30,30,30,40,40,40,18,18,18,0 },
        { 12,12,12,4,4,4,8,8,8,12,12,12,16,16,16,20,20,20,24,24,24,28,28,28,36,36,36,2,2,2,2,2,2,2,2,2,26,26,26,0 },
        { 6,6,6,6,6,6,6,6,6,6,6,6,8,8,8,10,10,10,14,14,14,18,18,18,26,26,26,32,32,32,42,42,42,18,18,18,0 },
        { 6,6,6,6,6,6,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,24,24,24,32,32,32,44,44,44,12,12,12,0 },
        { 6,6,6,6,6,6,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,24,24,24,30,30,30,40,40,40,18,18,18,0 },
        { 4,4,4,4,4,4,6,6,4,4,4,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,22,22,22,30,30,30,56,56,56,0 },
        { 4,4,4,4,4,4,6,6,4,4,4,6,6,6,6,6,6,10,10,10,12,12,12,14,14,14,16,16,16,20,20,20,26,26,26,66,66,66,0 },
        { 4,4,4,4,4,4,6,6,4,4,4,6,6,6,8,8,8,12,12,12,16,16,16,20,20,20,26,26,26,34,34,34,42,42,42,12,12,12,0 }
    };

    unsigned tables, scfsi = 0;
    int main_data_begin, part_23_sum = 0;
    int sr_idx = HDR_GET_MY_SAMPLE_RATE(hdr); sr_idx -= (sr_idx != 0);
    int gr_count = HDR_IS_MONO(hdr) ? 1 : 2;

    if (HDR_TEST_MPEG1(hdr))
    {
        gr_count *= 2;
        main_data_begin = get_bits(bs, 9);
        scfsi = get_bits(bs, 7 + gr_count);
    } else
    {
        main_data_begin = get_bits(bs, 8 + gr_count) >> gr_count;
    }

    do
    {
        if (HDR_IS_MONO(hdr))
        {
            scfsi <<= 4;
        }
        gr->part_23_length = (uint16_t)get_bits(bs, 12);
        part_23_sum += gr->part_23_length;
        gr->big_values = (uint16_t)get_bits(bs,  9);
        if (gr->big_values > 288)
        {
            return -1;
        }
        gr->global_gain = (uint8_t)get_bits(bs, 8);
        gr->scalefac_compress = (uint16_t)get_bits(bs, HDR_TEST_MPEG1(hdr) ? 4 : 9);
        gr->sfbtab = g_scf_long[sr_idx];
        gr->n_long_sfb  = 22;
        gr->n_short_sfb = 0;
        if (get_bits(bs, 1))
        {
            gr->block_type = (uint8_t)get_bits(bs, 2);
            if (!gr->block_type)
            {
                return -1;
            }
            gr->mixed_block_flag = (uint8_t)get_bits(bs, 1);
            gr->region_count[0] = 7;
            gr->region_count[1] = 255;
            if (gr->block_type == SHORT_BLOCK_TYPE)
            {
                scfsi &= 0x0F0F;
                if (!gr->mixed_block_flag)
                {
                    gr->region_count[0] = 8;
                    gr->sfbtab = g_scf_short[sr_idx];
                    gr->n_long_sfb = 0;
                    gr->n_short_sfb = 39;
                } else
                {
                    gr->sfbtab = g_scf_mixed[sr_idx];
                    gr->n_long_sfb = HDR_TEST_MPEG1(hdr) ? 8 : 6;
                    gr->n_short_sfb = 30;
                }
            }
            tables = get_bits(bs, 10);
            tables <<= 5;
            gr->subblock_gain[0] = (uint8_t)get_bits(bs, 3);
            gr->subblock_gain[1] = (uint8_t)get_bits(bs, 3);
            gr->subblock_gain[2] = (uint8_t)get_bits(bs, 3);
        } else
        {
            gr->block_type = 0;
            gr->mixed_block_flag = 0;
            tables = get_bits(bs, 15);
            gr->region_count[0] = (uint8_t)get_bits(bs, 4);
            gr->region_count[1] = (uint8_t)get_bits(bs, 3);
            gr->region_count[2] = 255;
        }
        gr->table_select[0] = (uint8_t)(tables >> 10);
        gr->table_select[1] = (uint8_t)((tables >> 5) & 31);
        gr->table_select[2] = (uint8_t)((tables) & 31);
        gr->preflag = HDR_TEST_MPEG1(hdr) ? get_bits(bs, 1) : (gr->scalefac_compress >= 500);
        gr->scalefac_scale = (uint8_t)get_bits(bs, 1);
        gr->count1_table = (uint8_t)get_bits(bs, 1);
        gr->scfsi = (uint8_t)((scfsi >> 12) & 15);
        scfsi <<= 4;
        gr++;
    } while(--gr_count);

    if (part_23_sum + bs->pos > bs->limit + main_data_begin*8)
    {
        return -1;
    }

    return main_data_begin;
}